

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivateContainer::updateTopBottomMargin(QComboBoxPrivateContainer *this)

{
  int iVar1;
  int h;
  QLayout *pQVar2;
  long *plVar3;
  QStyle *pQVar4;
  long *plVar5;
  QSpacerItem *this_00;
  QSpacerItem *this_01;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  QStyleOptionComboBox QStack_b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QWidget::layout((QWidget *)this);
  if (pQVar2 != (QLayout *)0x0) {
    pQVar2 = QWidget::layout((QWidget *)this);
    iVar1 = (**(code **)(*(long *)pQVar2 + 200))(pQVar2);
    if (0 < iVar1) {
      QWidget::layout((QWidget *)this);
      plVar3 = (long *)QMetaObject::cast((QObject *)&QBoxLayout::staticMetaObject);
      if (plVar3 != (long *)0x0) {
        memset(&QStack_b8,0xaa,0x90);
        comboStyleOption(&QStack_b8,this);
        pQVar4 = QWidget::style(&this->combo->super_QWidget);
        h = 0;
        iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x19,&QStack_b8,this->combo);
        if (iVar1 != 0) {
          pQVar4 = QWidget::style(&this->combo->super_QWidget);
          h = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x1d,&QStack_b8,this->combo);
        }
        plVar5 = (long *)(**(code **)(*plVar3 + 0xa8))(plVar3);
        this_00 = (QSpacerItem *)(**(code **)(*plVar5 + 0x78))(plVar5);
        if (this_00 != (QSpacerItem *)0x0) {
          QSpacerItem::changeSize(this_00,0,h,Minimum,Fixed);
        }
        (**(code **)(*plVar3 + 200))(plVar3);
        plVar5 = (long *)(**(code **)(*plVar3 + 0xa8))(plVar3);
        this_01 = (QSpacerItem *)(**(code **)(*plVar5 + 0x78))(plVar5);
        if ((this_01 != (QSpacerItem *)0x0) && (this_01 != this_00)) {
          QSpacerItem::changeSize(this_01,0,h,Minimum,Fixed);
        }
        (**(code **)(*plVar3 + 0x70))(plVar3);
        QIcon::~QIcon(&QStack_b8.currentIcon);
        if (&(QStack_b8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
              ._M_i == 0) {
            QArrayData::deallocate(&(QStack_b8.currentText.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStyleOption::~QStyleOption((QStyleOption *)&QStack_b8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::updateTopBottomMargin()
{
    if (!layout() || layout()->count() < 1)
        return;

    QBoxLayout *boxLayout = qobject_cast<QBoxLayout *>(layout());
    if (!boxLayout)
        return;

    const QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
    const int margin = usePopup ? combo->style()->pixelMetric(QStyle::PM_MenuVMargin, &opt, combo) : 0;

    QSpacerItem *topSpacer = boxLayout->itemAt(0)->spacerItem();
    if (topSpacer)
        topSpacer->changeSize(0, margin, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QSpacerItem *bottomSpacer = boxLayout->itemAt(boxLayout->count() - 1)->spacerItem();
    if (bottomSpacer && bottomSpacer != topSpacer)
        bottomSpacer->changeSize(0, margin, QSizePolicy::Minimum, QSizePolicy::Fixed);

    boxLayout->invalidate();
}